

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::ClearRenderTarget
          (DeviceContextBase<Diligent::EngineGLImplTraits> *this,ITextureView *pView)

{
  ulong uVar1;
  Uint32 *pUVar2;
  ITextureView *pIVar3;
  COMMAND_QUEUE_TYPE CVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar6;
  COMMAND_QUEUE_TYPE in_DL;
  COMMAND_QUEUE_TYPE extraout_DL;
  COMMAND_QUEUE_TYPE extraout_DL_00;
  COMMAND_QUEUE_TYPE extraout_DL_01;
  COMMAND_QUEUE_TYPE extraout_DL_02;
  char *in_R8;
  char (*in_R9) [8];
  string msg;
  _Alloc_hider in_stack_ffffffffffffff98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  String local_48;
  char (*Args) [21];
  
  if (pView == (ITextureView *)0x0) {
    FormatString<char[45]>
              ((string *)&stack0xffffffffffffff98,
               (char (*) [45])"Render target view to clear must not be null");
    DebugAssertionFailed
              (in_stack_ffffffffffffff98._M_p,"ClearRenderTarget",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x65a);
    in_DL = extraout_DL;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffff98._M_p != &local_58) {
      operator_delete(in_stack_ffffffffffffff98._M_p,local_58._M_allocated_capacity + 1);
      in_DL = extraout_DL_00;
    }
  }
  CVar4 = (this->m_Desc).QueueType;
  if (CVar4 == COMMAND_QUEUE_TYPE_UNKNOWN) {
    if ((this->m_Desc).IsDeferred == false) {
      FormatString<char[79]>
                ((string *)&stack0xffffffffffffff98,
                 (char (*) [79])
                 "Queue type may never be unknown for immediate contexts. This looks like a bug.");
      DebugAssertionFailed
                (in_stack_ffffffffffffff98._M_p,"ClearRenderTarget",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x65b);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)in_stack_ffffffffffffff98._M_p != &local_58) {
        operator_delete(in_stack_ffffffffffffff98._M_p,local_58._M_allocated_capacity + 1);
      }
    }
    FormatString<char[97]>
              ((string *)&stack0xffffffffffffff98,
               (char (*) [97])
               "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    DebugAssertionFailed
              (in_stack_ffffffffffffff98._M_p,"ClearRenderTarget",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x65b);
    in_DL = extraout_DL_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffff98._M_p != &local_58) {
      operator_delete(in_stack_ffffffffffffff98._M_p,local_58._M_allocated_capacity + 1);
      in_DL = extraout_DL_02;
    }
    CVar4 = (this->m_Desc).QueueType;
  }
  if ((~CVar4 & 7) != 0) {
    GetCommandQueueTypeString_abi_cxx11_(&local_48,(Diligent *)(ulong)CVar4,in_DL);
    in_R8 = " queue.";
    FormatString<char[18],char[22],std::__cxx11::string,char[8]>
              ((string *)&stack0xffffffffffffff98,(Diligent *)"ClearRenderTarget",
               (char (*) [18])0x90701a,(char (*) [22])&local_48,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",in_R9)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    DebugAssertionFailed
              (in_stack_ffffffffffffff98._M_p,"ClearRenderTarget",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x65b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffff98._M_p != &local_58) {
      operator_delete(in_stack_ffffffffffffff98._M_p,local_58._M_allocated_capacity + 1);
    }
  }
  iVar5 = (*(pView->super_IDeviceObject).super_IObject._vptr_IObject[4])(pView);
  Args = (char (*) [21])CONCAT44(extraout_var,iVar5);
  if ((*Args)[8] != TEXTURE_VIEW_RENDER_TARGET) {
    local_48._M_dataplus._M_p = GetTexViewTypeLiteralName((*Args)[8]);
    iVar5 = (*(pView->super_IDeviceObject).super_IObject._vptr_IObject[4])(pView);
    in_R8 = (char *)CONCAT44(extraout_var_00,iVar5);
    FormatString<char[11],char_const*,char[20],char_const*,char[97]>
              ((string *)&stack0xffffffffffffff98,(Diligent *)"The type (",(char (*) [11])&local_48,
               (char **)") of texture view \'",(char (*) [20])in_R8,
               (char **)
               "\' is invalid: ClearRenderTarget command expects render target view (TEXTURE_VIEW_RENDER_TARGET)."
               ,(char (*) [97])in_stack_ffffffffffffff98._M_p);
    DebugAssertionFailed
              (in_stack_ffffffffffffff98._M_p,"ClearRenderTarget",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x662);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffff98._M_p != &local_58) {
      operator_delete(in_stack_ffffffffffffff98._M_p,local_58._M_allocated_capacity + 1);
    }
  }
  if ((ulong)this->m_NumBoundRenderTargets != 0) {
    lVar6 = 0x9b;
    do {
      pIVar3 = *(ITextureView **)((long)this->m_VertexStreams + lVar6 * 8 + -0x18);
      if (pIVar3 == pView) break;
      uVar1 = lVar6 - 0x9a;
      lVar6 = lVar6 + 1;
    } while (uVar1 < this->m_NumBoundRenderTargets);
    if (pIVar3 == pView) goto LAB_00332fa9;
  }
  if ((this->m_pActiveRenderPass).m_pObject != (RenderPassGLImpl *)0x0) {
    FormatString<char[21],char_const*,char[158]>
              ((string *)&stack0xffffffffffffff98,(Diligent *)"Render target view \'",Args,
               (char **)
               "\' is not bound as framebuffer attachment. ClearRenderTarget command inside a render pass requires render target view to be bound as a framebuffer attachment."
               ,(char (*) [158])in_R8);
    DebugAssertionFailed
              (in_stack_ffffffffffffff98._M_p,"ClearRenderTarget",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x66f);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffff98._M_p != &local_58) {
      operator_delete(in_stack_ffffffffffffff98._M_p,local_58._M_allocated_capacity + 1);
    }
  }
  if ((((this->m_pDevice).m_pObject)->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).
      m_DeviceInfo.Type - RENDER_DEVICE_TYPE_GL < 2) {
    FormatString<char[21],char_const*,char[144]>
              ((string *)&stack0xffffffffffffff98,(Diligent *)"Render target view \'",Args,
               (char **)
               "\' is not bound to the device context. ClearRenderTarget command requires render target view to be bound to the device context in OpenGL backend"
               ,(char (*) [144])in_R8);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,in_stack_ffffffffffffff98._M_p,0,0,0);
    }
  }
  else {
    FormatString<char[21],char_const*,char[191]>
              ((string *)&stack0xffffffffffffff98,(Diligent *)"Render target view \'",Args,
               (char **)
               "\' is not bound to the device context. ClearRenderTarget command is more efficient if render target view is bound to the device context. In OpenGL, Metal and WebGPU backends this is required."
               ,(char (*) [191])in_R8);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(1,in_stack_ffffffffffffff98._M_p,0,0,0);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_ffffffffffffff98._M_p != &local_58) {
    operator_delete(in_stack_ffffffffffffff98._M_p,local_58._M_allocated_capacity + 1);
  }
LAB_00332fa9:
  pUVar2 = &(this->m_Stats).CommandCounters.ClearRenderTarget;
  *pUVar2 = *pUVar2 + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::ClearRenderTarget(ITextureView* pView)
{
    DEV_CHECK_ERR(pView != nullptr, "Render target view to clear must not be null");
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "ClearRenderTarget");

#ifdef DILIGENT_DEVELOPMENT
    {
        const TextureViewDesc& ViewDesc = pView->GetDesc();
        DEV_CHECK_ERR(ViewDesc.ViewType == TEXTURE_VIEW_RENDER_TARGET,
                      "The type (", GetTexViewTypeLiteralName(ViewDesc.ViewType), ") of texture view '", pView->GetDesc().Name,
                      "' is invalid: ClearRenderTarget command expects render target view (TEXTURE_VIEW_RENDER_TARGET).");

        bool RTFound = false;
        for (Uint32 i = 0; i < m_NumBoundRenderTargets && !RTFound; ++i)
        {
            RTFound = m_pBoundRenderTargets[i] == pView;
        }

        if (!RTFound)
        {
            DEV_CHECK_ERR(m_pActiveRenderPass == nullptr,
                          "Render target view '", ViewDesc.Name,
                          "' is not bound as framebuffer attachment. ClearRenderTarget command inside a render pass "
                          "requires render target view to be bound as a framebuffer attachment.");

            if (m_pDevice->GetDeviceInfo().IsGLDevice())
            {
                LOG_ERROR_MESSAGE("Render target view '", ViewDesc.Name,
                                  "' is not bound to the device context. ClearRenderTarget command "
                                  "requires render target view to be bound to the device context in OpenGL backend");
            }
            else
            {
                LOG_DVP_WARNING_MESSAGE("Render target view '", ViewDesc.Name,
                                        "' is not bound to the device context. ClearRenderTarget command is more efficient "
                                        "if render target view is bound to the device context. In OpenGL, Metal and WebGPU backends this is required.");
            }
        }
    }
#endif

    ++m_Stats.CommandCounters.ClearRenderTarget;
}